

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_op_movl(DisasContext *s,int d_offset,int s_offset)

{
  TCGContext *tcg_ctx;
  
  tcg_ctx = s->uc->tcg_ctx;
  tcg_gen_ld_i32(tcg_ctx,s->tmp2_i32,tcg_ctx->cpu_env,(long)s_offset);
  tcg_gen_st_i32(tcg_ctx,s->tmp2_i32,tcg_ctx->cpu_env,(long)d_offset);
  return;
}

Assistant:

static inline void gen_op_movl(DisasContext *s, int d_offset, int s_offset)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    tcg_gen_ld_i32(tcg_ctx, s->tmp2_i32, tcg_ctx->cpu_env, s_offset);
    tcg_gen_st_i32(tcg_ctx, s->tmp2_i32, tcg_ctx->cpu_env, d_offset);
}